

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall
slang::ast::Scope::handleExportedMethods
          (Scope *this,span<slang::ast::Symbol_*const,_18446744073709551615UL> deferredMembers)

{
  pointer ppSVar1;
  SyntaxKind *pSVar2;
  char *pcVar3;
  short sVar4;
  int *piVar5;
  long lVar6;
  SyntaxNode *pSVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar8;
  long lVar9;
  ModportSubroutinePortSyntax *pMVar10;
  char *pcVar11;
  ModportSubroutinePortSyntax *pMVar12;
  uint uVar13;
  byte bVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  undefined1 uVar19;
  byte bVar20;
  size_t sVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  bool bVar24;
  byte bVar25;
  int iVar26;
  uint uVar27;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar28;
  byte *pbVar29;
  ulong uVar30;
  uint64_t uVar31;
  MethodPrototypeSymbol *pMVar32;
  ulong uVar33;
  ulong uVar34;
  size_type __rlen_3;
  char *pcVar35;
  long lVar36;
  pointer ppSVar37;
  ulong uVar38;
  char *pcVar39;
  long lVar40;
  ulong uVar41;
  value_type *pvVar42;
  size_type __rlen;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  size_t pos;
  try_emplace_args_t local_299;
  value_type *elements;
  string_view name;
  ModportSubroutinePortSyntax *local_210;
  locator res;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  waitingForImport;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  foundImports;
  
  ppSVar37 = deferredMembers._M_ptr;
  waitingForImport.super_Storage.ptr = (char *)&waitingForImport;
  waitingForImport._80_8_ = 0x3f;
  waitingForImport._88_8_ = 1;
  waitingForImport._96_16_ = ZEXT816(0x5122f0);
  waitingForImport._112_16_ = (undefined1  [16])0x0;
  foundImports.super_Storage.ptr = (char *)&foundImports;
  foundImports._112_8_ = 0x3f;
  foundImports._120_8_ = 1;
  foundImports._128_16_ = ZEXT816(0x5122f0);
  foundImports._144_16_ = (undefined1  [16])0x0;
  waitingForImport.super_Storage._72_8_ = waitingForImport.super_Storage.ptr;
  foundImports.super_Storage._104_8_ = foundImports.super_Storage.ptr;
  if (deferredMembers._M_extent._M_extent_value._M_extent_value != 0) {
    ppSVar1 = ppSVar37 + deferredMembers._M_extent._M_extent_value._M_extent_value;
    do {
      piVar5 = *(int **)(*ppSVar37 + 1);
      if ((*piVar5 == 0x12d) && (lVar6 = *(long *)(piVar5 + 0x24), 1 < lVar6 + 1U)) {
        uVar30 = 0;
        do {
          ppSVar28 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )(uVar30 * 0x30 + *(long *)(piVar5 + 0x22)));
          pSVar7 = (*ppSVar28)[1].previewNode;
          pbVar29 = (byte *)((long)&(pSVar7[3].previewNode)->kind + 1);
          if ((byte *)0x1 < pbVar29) {
            uVar33 = 0;
            do {
              ppSVar28 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)(pSVar7[3].parent + uVar33 * 2));
              pSVar8 = *ppSVar28;
              if ((pSVar8->kind == ModportSubroutinePortList) &&
                 (lVar9 = *(long *)(pSVar8 + 6), 1 < lVar9 + 1U)) {
                sVar4 = *(short *)&pSVar8[3].parent;
                uVar34 = 0;
                do {
                  ppSVar28 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         *)(pSVar8[5].previewNode + uVar34 * 2));
                  pMVar10 = (ModportSubroutinePortSyntax *)*ppSVar28;
                  if ((pMVar10->super_ModportPortSyntax).super_SyntaxNode.kind == ModportNamedPort)
                  {
                    if ((sVar4 == 0xa5) &&
                       (name = parsing::Token::valueText((Token *)&pMVar10->prototype),
                       name._M_len != 0)) {
                      pvVar42 = (value_type *)this->nameMap;
                      uVar31 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                               operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                           *)pvVar42,&name);
                      uVar38 = uVar31 >> ((byte)(pvVar42->first)._M_len & 0x3f);
                      pMVar10 = pvVar42->second;
                      lVar40 = (uVar31 & 0xff) * 4;
                      uVar19 = (&UNK_0051239c)[lVar40];
                      bVar18 = (&UNK_0051239d)[lVar40];
                      bVar25 = (&UNK_0051239e)[lVar40];
                      bVar20 = (&UNK_0051239f)[lVar40];
                      sVar21 = name._M_len;
                      pcVar3 = name._M_str;
                      pcVar35 = (char *)0x0;
                      elements = pvVar42;
                      do {
                        pSVar2 = &(pMVar10->super_ModportPortSyntax).super_SyntaxNode.kind +
                                 uVar38 * 4;
                        bVar14 = *(byte *)((long)pSVar2 + 0xf);
                        auVar44[0] = -((char)*pSVar2 == uVar19);
                        auVar44[1] = -(*(byte *)((long)pSVar2 + 1) == bVar18);
                        auVar44[2] = -(*(byte *)((long)pSVar2 + 2) == bVar25);
                        auVar44[3] = -(*(byte *)((long)pSVar2 + 3) == bVar20);
                        auVar44[4] = -(*(undefined1 *)(pSVar2 + 1) == uVar19);
                        auVar44[5] = -(*(byte *)((long)pSVar2 + 5) == bVar18);
                        auVar44[6] = -(*(byte *)((long)pSVar2 + 6) == bVar25);
                        auVar44[7] = -(*(byte *)((long)pSVar2 + 7) == bVar20);
                        auVar44[8] = -(*(undefined1 *)(pSVar2 + 2) == uVar19);
                        auVar44[9] = -(*(byte *)((long)pSVar2 + 9) == bVar18);
                        auVar44[10] = -(*(byte *)((long)pSVar2 + 10) == bVar25);
                        auVar44[0xb] = -(*(byte *)((long)pSVar2 + 0xb) == bVar20);
                        auVar44[0xc] = -(*(undefined1 *)(pSVar2 + 3) == uVar19);
                        auVar44[0xd] = -(*(byte *)((long)pSVar2 + 0xd) == bVar18);
                        auVar44[0xe] = -(*(byte *)((long)pSVar2 + 0xe) == bVar25);
                        auVar44[0xf] = -(bVar14 == bVar20);
                        uVar27 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                                (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                                (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                                (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                                (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                                (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                                (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                                (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                                (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                                (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                                (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                                (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                                (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                                (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe);
                        if (uVar27 != 0) {
                          lVar40 = elements[1].first._M_len + uVar38 * 0x168;
                          do {
                            uVar13 = 0;
                            if (uVar27 != 0) {
                              for (; (uVar27 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                              }
                            }
                            if ((sVar21 == *(size_t *)(lVar40 + (ulong)uVar13 * 0x18)) &&
                               ((sVar21 == 0 ||
                                (iVar26 = bcmp(pcVar3,*(void **)(lVar40 + 8 + (ulong)uVar13 * 0x18),
                                               sVar21), iVar26 == 0)))) goto LAB_00428503;
                            uVar27 = uVar27 - 1 & uVar27;
                          } while (uVar27 != 0);
                        }
                        if (((&boost::unordered::detail::foa::
                               group15<boost::unordered::detail::foa::plain_integral>::
                               is_not_overflowed(unsigned_long)::shift)[(uint)uVar31 & 7] & bVar14)
                            == 0) break;
                        pcVar11 = (elements->first)._M_str;
                        pcVar39 = pcVar35 + uVar38 + 1;
                        pcVar35 = pcVar35 + 1;
                        uVar38 = (ulong)pcVar39 & (ulong)pcVar11;
                      } while (pcVar35 <= pcVar11);
                      uVar31 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                               operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                           *)&foundImports.super_Storage.field_0x68,&name);
                      uVar22 = foundImports._120_8_;
                      uVar38 = uVar31 >> (foundImports._112_1_ & 0x3f);
                      uVar23 = foundImports._128_8_;
                      lVar40 = (uVar31 & 0xff) * 4;
                      cVar15 = (&UNK_0051239c)[lVar40];
                      cVar16 = (&UNK_0051239d)[lVar40];
                      cVar17 = (&UNK_0051239e)[lVar40];
                      bVar18 = (&UNK_0051239f)[lVar40];
                      elements = (value_type *)foundImports._136_8_;
                      sVar21 = name._M_len;
                      pcVar3 = name._M_str;
                      uVar43 = 0;
                      do {
                        pvVar42 = elements;
                        pcVar35 = (char *)(uVar23 + uVar38 * 0x10);
                        bVar25 = pcVar35[0xf];
                        auVar45[0] = -(*pcVar35 == cVar15);
                        auVar45[1] = -(pcVar35[1] == cVar16);
                        auVar45[2] = -(pcVar35[2] == cVar17);
                        auVar45[3] = -(pcVar35[3] == bVar18);
                        auVar45[4] = -(pcVar35[4] == cVar15);
                        auVar45[5] = -(pcVar35[5] == cVar16);
                        auVar45[6] = -(pcVar35[6] == cVar17);
                        auVar45[7] = -(pcVar35[7] == bVar18);
                        auVar45[8] = -(pcVar35[8] == cVar15);
                        auVar45[9] = -(pcVar35[9] == cVar16);
                        auVar45[10] = -(pcVar35[10] == cVar17);
                        auVar45[0xb] = -(pcVar35[0xb] == bVar18);
                        auVar45[0xc] = -(pcVar35[0xc] == cVar15);
                        auVar45[0xd] = -(pcVar35[0xd] == cVar16);
                        auVar45[0xe] = -(pcVar35[0xe] == cVar17);
                        auVar45[0xf] = -(bVar25 == bVar18);
                        for (uVar27 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                                     (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                                     (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                                     (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                                     (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                                     (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                                     (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                                     (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                                     (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                                     (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                                     (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                                     (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb
                                                     | (ushort)(SUB161(auVar45 >> 0x67,0) & 1) <<
                                                       0xc | (ushort)(SUB161(auVar45 >> 0x6f,0) & 1)
                                                             << 0xd |
                                                    (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
                            uVar27 != 0; uVar27 = uVar27 - 1 & uVar27) {
                          uVar13 = 0;
                          if (uVar27 != 0) {
                            for (; (uVar27 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                            }
                          }
                          uVar41 = (ulong)uVar13;
                          if ((sVar21 == pvVar42[uVar38 * 0xf + uVar41].first._M_len) &&
                             ((sVar21 == 0 ||
                              (iVar26 = bcmp(pcVar3,pvVar42[uVar38 * 0xf + uVar41].first._M_str,
                                             sVar21), iVar26 == 0)))) {
                            pMVar32 = MethodPrototypeSymbol::implicitExtern
                                                (this,pvVar42[uVar38 * 0xf + uVar41].second);
                            insertMember(this,&pMVar32->super_Symbol,(Symbol *)0x0,true,true);
                            goto LAB_00428503;
                          }
                        }
                        if (((&boost::unordered::detail::foa::
                               group15<boost::unordered::detail::foa::plain_integral>::
                               is_not_overflowed(unsigned_long)::shift)[(uint)uVar31 & 7] & bVar25)
                            == 0) break;
                        lVar40 = uVar38 + uVar43;
                        uVar43 = uVar43 + 1;
                        uVar38 = lVar40 + 1U & uVar22;
                      } while (uVar43 <= (ulong)uVar22);
                      uVar31 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                               operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                           *)&waitingForImport.super_Storage.field_0x48,&name);
                      uVar22 = waitingForImport._88_8_;
                      uVar41 = uVar31 >> (waitingForImport._80_1_ & 0x3f);
                      uVar23 = waitingForImport._96_8_;
                      lVar40 = (uVar31 & 0xff) * 4;
                      cVar15 = (&UNK_0051239c)[lVar40];
                      cVar16 = (&UNK_0051239d)[lVar40];
                      cVar17 = (&UNK_0051239e)[lVar40];
                      bVar18 = (&UNK_0051239f)[lVar40];
                      elements = (value_type *)waitingForImport._104_8_;
                      sVar21 = name._M_len;
                      pcVar3 = name._M_str;
                      uVar43 = 0;
                      uVar38 = uVar41;
                      do {
                        pvVar42 = elements;
                        pcVar35 = (char *)(uVar23 + uVar38 * 0x10);
                        bVar25 = pcVar35[0xf];
                        auVar46[0] = -(*pcVar35 == cVar15);
                        auVar46[1] = -(pcVar35[1] == cVar16);
                        auVar46[2] = -(pcVar35[2] == cVar17);
                        auVar46[3] = -(pcVar35[3] == bVar18);
                        auVar46[4] = -(pcVar35[4] == cVar15);
                        auVar46[5] = -(pcVar35[5] == cVar16);
                        auVar46[6] = -(pcVar35[6] == cVar17);
                        auVar46[7] = -(pcVar35[7] == bVar18);
                        auVar46[8] = -(pcVar35[8] == cVar15);
                        auVar46[9] = -(pcVar35[9] == cVar16);
                        auVar46[10] = -(pcVar35[10] == cVar17);
                        auVar46[0xb] = -(pcVar35[0xb] == bVar18);
                        auVar46[0xc] = -(pcVar35[0xc] == cVar15);
                        auVar46[0xd] = -(pcVar35[0xd] == cVar16);
                        auVar46[0xe] = -(pcVar35[0xe] == cVar17);
                        auVar46[0xf] = -(bVar25 == bVar18);
                        for (uVar27 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                                     (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                                     (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                                     (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                                     (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                                     (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                                     (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                                     (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                                     (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                                     (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                                     (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                                     (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb
                                                     | (ushort)(SUB161(auVar46 >> 0x67,0) & 1) <<
                                                       0xc | (ushort)(SUB161(auVar46 >> 0x6f,0) & 1)
                                                             << 0xd |
                                                    (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
                            uVar27 != 0; uVar27 = uVar27 - 1 & uVar27) {
                          iVar26 = 0;
                          if (uVar27 != 0) {
                            for (; (uVar27 >> iVar26 & 1) == 0; iVar26 = iVar26 + 1) {
                            }
                          }
                          if ((sVar21 == *(size_t *)
                                          ((long)&pvVar42[uVar38 * 10].first._M_len +
                                          (ulong)(uint)(iVar26 << 4))) &&
                             ((sVar21 == 0 ||
                              (iVar26 = bcmp(pcVar3,*(void **)((long)&pvVar42[uVar38 * 10].first.
                                                                      _M_str +
                                                              (ulong)(uint)(iVar26 << 4)),sVar21),
                              iVar26 == 0)))) goto LAB_00428503;
                        }
                        if (((&boost::unordered::detail::foa::
                               group15<boost::unordered::detail::foa::plain_integral>::
                               is_not_overflowed(unsigned_long)::shift)[(uint)uVar31 & 7] & bVar25)
                            == 0) break;
                        lVar40 = uVar38 + uVar43;
                        uVar43 = uVar43 + 1;
                        uVar38 = lVar40 + 1U & uVar22;
                      } while (uVar43 <= (ulong)uVar22);
                      if ((ulong)waitingForImport._120_8_ < (ulong)waitingForImport._112_8_) {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                        ::
                        nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                                  (&res,(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                         *)&waitingForImport.super_Storage.field_0x48,
                                   (arrays_type *)&waitingForImport.field_0x50,uVar41,uVar31,&name);
                        waitingForImport._120_8_ = waitingForImport._120_8_ + 1;
                      }
                      else {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                        ::
                        unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                                  (&res,(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                         *)&waitingForImport.super_Storage.field_0x48,uVar31,&name);
                      }
                    }
                  }
                  else {
                    res._0_16_ = slang::syntax::SyntaxNode::getLastToken
                                           ((SyntaxNode *)(((pMVar10->prototype).ptr)->name).ptr);
                    name = parsing::Token::valueText((Token *)&res);
                    if (name._M_len != 0) {
                      pvVar42 = (value_type *)this->nameMap;
                      uVar31 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                               operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                           *)pvVar42,&name);
                      uVar38 = uVar31 >> ((byte)(pvVar42->first)._M_len & 0x3f);
                      pMVar12 = pvVar42->second;
                      lVar40 = (uVar31 & 0xff) * 4;
                      uVar19 = (&UNK_0051239c)[lVar40];
                      bVar18 = (&UNK_0051239d)[lVar40];
                      bVar25 = (&UNK_0051239e)[lVar40];
                      bVar20 = (&UNK_0051239f)[lVar40];
                      sVar21 = name._M_len;
                      pcVar3 = name._M_str;
                      pcVar35 = (char *)0x0;
                      elements = pvVar42;
                      do {
                        pSVar2 = &(pMVar12->super_ModportPortSyntax).super_SyntaxNode.kind +
                                 uVar38 * 4;
                        bVar14 = *(byte *)((long)pSVar2 + 0xf);
                        auVar47[0] = -((char)*pSVar2 == uVar19);
                        auVar47[1] = -(*(byte *)((long)pSVar2 + 1) == bVar18);
                        auVar47[2] = -(*(byte *)((long)pSVar2 + 2) == bVar25);
                        auVar47[3] = -(*(byte *)((long)pSVar2 + 3) == bVar20);
                        auVar47[4] = -(*(undefined1 *)(pSVar2 + 1) == uVar19);
                        auVar47[5] = -(*(byte *)((long)pSVar2 + 5) == bVar18);
                        auVar47[6] = -(*(byte *)((long)pSVar2 + 6) == bVar25);
                        auVar47[7] = -(*(byte *)((long)pSVar2 + 7) == bVar20);
                        auVar47[8] = -(*(undefined1 *)(pSVar2 + 2) == uVar19);
                        auVar47[9] = -(*(byte *)((long)pSVar2 + 9) == bVar18);
                        auVar47[10] = -(*(byte *)((long)pSVar2 + 10) == bVar25);
                        auVar47[0xb] = -(*(byte *)((long)pSVar2 + 0xb) == bVar20);
                        auVar47[0xc] = -(*(undefined1 *)(pSVar2 + 3) == uVar19);
                        auVar47[0xd] = -(*(byte *)((long)pSVar2 + 0xd) == bVar18);
                        auVar47[0xe] = -(*(byte *)((long)pSVar2 + 0xe) == bVar25);
                        auVar47[0xf] = -(bVar14 == bVar20);
                        uVar27 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                                                (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                                (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                                (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                                (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                                (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                                (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                                (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                                                (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                                                (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                                                (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                                                (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                                                (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                                                (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe);
                        if (uVar27 != 0) {
                          lVar40 = elements[1].first._M_len + uVar38 * 0x168;
                          do {
                            uVar13 = 0;
                            if (uVar27 != 0) {
                              for (; (uVar27 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                              }
                            }
                            if ((sVar21 == *(size_t *)(lVar40 + (ulong)uVar13 * 0x18)) &&
                               ((sVar21 == 0 ||
                                (iVar26 = bcmp(pcVar3,*(void **)(lVar40 + 8 + (ulong)uVar13 * 0x18),
                                               sVar21), iVar26 == 0)))) goto LAB_00428503;
                            uVar27 = uVar27 - 1 & uVar27;
                          } while (uVar27 != 0);
                        }
                        if (((&boost::unordered::detail::foa::
                               group15<boost::unordered::detail::foa::plain_integral>::
                               is_not_overflowed(unsigned_long)::shift)[(uint)uVar31 & 7] & bVar14)
                            == 0) break;
                        pcVar11 = (elements->first)._M_str;
                        pcVar39 = pcVar35 + uVar38 + 1;
                        pcVar35 = pcVar35 + 1;
                        uVar38 = (ulong)pcVar39 & (ulong)pcVar11;
                      } while (pcVar35 <= pcVar11);
                      if (sVar4 == 0xa5) {
LAB_0042865b:
                        pMVar32 = MethodPrototypeSymbol::implicitExtern(this,pMVar10);
                        insertMember(this,&pMVar32->super_Symbol,(Symbol *)0x0,true,true);
                      }
                      else {
                        uVar31 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                                 operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                             *)&waitingForImport.super_Storage.field_0x48,&name);
                        uVar22 = waitingForImport._88_8_;
                        uVar38 = uVar31 >> (waitingForImport._80_1_ & 0x3f);
                        uVar23 = waitingForImport._96_8_;
                        lVar40 = (uVar31 & 0xff) * 4;
                        cVar15 = (&UNK_0051239c)[lVar40];
                        cVar16 = (&UNK_0051239d)[lVar40];
                        cVar17 = (&UNK_0051239e)[lVar40];
                        bVar18 = (&UNK_0051239f)[lVar40];
                        elements = (value_type *)waitingForImport._104_8_;
                        sVar21 = name._M_len;
                        pcVar3 = name._M_str;
                        uVar43 = 0;
                        do {
                          pvVar42 = elements;
                          pcVar35 = (char *)(uVar23 + uVar38 * 0x10);
                          bVar25 = pcVar35[0xf];
                          auVar48[0] = -(*pcVar35 == cVar15);
                          auVar48[1] = -(pcVar35[1] == cVar16);
                          auVar48[2] = -(pcVar35[2] == cVar17);
                          auVar48[3] = -(pcVar35[3] == bVar18);
                          auVar48[4] = -(pcVar35[4] == cVar15);
                          auVar48[5] = -(pcVar35[5] == cVar16);
                          auVar48[6] = -(pcVar35[6] == cVar17);
                          auVar48[7] = -(pcVar35[7] == bVar18);
                          auVar48[8] = -(pcVar35[8] == cVar15);
                          auVar48[9] = -(pcVar35[9] == cVar16);
                          auVar48[10] = -(pcVar35[10] == cVar17);
                          auVar48[0xb] = -(pcVar35[0xb] == bVar18);
                          auVar48[0xc] = -(pcVar35[0xc] == cVar15);
                          auVar48[0xd] = -(pcVar35[0xd] == cVar16);
                          auVar48[0xe] = -(pcVar35[0xe] == cVar17);
                          auVar48[0xf] = -(bVar25 == bVar18);
                          for (uVar27 = (uint)(ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                                                       (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                                                       (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2
                                                       | (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) <<
                                                         3 | (ushort)(SUB161(auVar48 >> 0x27,0) & 1)
                                                             << 4 |
                                                       (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5
                                                       | (ushort)(SUB161(auVar48 >> 0x37,0) & 1) <<
                                                         6 | (ushort)(SUB161(auVar48 >> 0x3f,0) & 1)
                                                             << 7 |
                                                       (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8
                                                       | (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) <<
                                                         9 | (ushort)(SUB161(auVar48 >> 0x57,0) & 1)
                                                             << 10 |
                                                       (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) <<
                                                       0xb | (ushort)(SUB161(auVar48 >> 0x67,0) & 1)
                                                             << 0xc |
                                                       (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) <<
                                                       0xd | (ushort)(SUB161(auVar48 >> 0x77,0) & 1)
                                                             << 0xe); uVar27 != 0;
                              uVar27 = uVar27 - 1 & uVar27) {
                            iVar26 = 0;
                            if (uVar27 != 0) {
                              for (; (uVar27 >> iVar26 & 1) == 0; iVar26 = iVar26 + 1) {
                              }
                            }
                            if ((sVar21 == *(size_t *)
                                            ((long)&pvVar42[uVar38 * 10].first._M_len +
                                            (ulong)(uint)(iVar26 << 4))) &&
                               ((sVar21 == 0 ||
                                (iVar26 = bcmp(pcVar3,*(void **)((long)&pvVar42[uVar38 * 10].first.
                                                                        _M_str +
                                                                (ulong)(uint)(iVar26 << 4)),sVar21),
                                iVar26 == 0)))) goto LAB_0042865b;
                          }
                          if (((&boost::unordered::detail::foa::
                                 group15<boost::unordered::detail::foa::plain_integral>::
                                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar31 & 7] & bVar25
                              ) == 0) break;
                          lVar40 = uVar38 + uVar43;
                          uVar43 = uVar43 + 1;
                          uVar38 = lVar40 + 1U & uVar22;
                        } while (uVar43 <= (ulong)uVar22);
                        local_210 = pMVar10;
                        uVar31 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                                 operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                             *)&foundImports.super_Storage.field_0x68,&name);
                        uVar41 = uVar31 >> (foundImports._112_1_ & 0x3f);
                        lVar40 = (uVar31 & 0xff) * 4;
                        cVar15 = (&UNK_0051239c)[lVar40];
                        cVar16 = (&UNK_0051239d)[lVar40];
                        cVar17 = (&UNK_0051239e)[lVar40];
                        bVar18 = (&UNK_0051239f)[lVar40];
                        pvVar42 = (value_type *)(ulong)((uint)uVar31 & 7);
                        uVar43 = 0;
                        uVar38 = uVar41;
                        do {
                          pcVar3 = (char *)(foundImports._128_8_ + uVar38 * 0x10);
                          bVar25 = pcVar3[0xf];
                          auVar49[0] = -(*pcVar3 == cVar15);
                          auVar49[1] = -(pcVar3[1] == cVar16);
                          auVar49[2] = -(pcVar3[2] == cVar17);
                          auVar49[3] = -(pcVar3[3] == bVar18);
                          auVar49[4] = -(pcVar3[4] == cVar15);
                          auVar49[5] = -(pcVar3[5] == cVar16);
                          auVar49[6] = -(pcVar3[6] == cVar17);
                          auVar49[7] = -(pcVar3[7] == bVar18);
                          auVar49[8] = -(pcVar3[8] == cVar15);
                          auVar49[9] = -(pcVar3[9] == cVar16);
                          auVar49[10] = -(pcVar3[10] == cVar17);
                          auVar49[0xb] = -(pcVar3[0xb] == bVar18);
                          auVar49[0xc] = -(pcVar3[0xc] == cVar15);
                          auVar49[0xd] = -(pcVar3[0xd] == cVar16);
                          auVar49[0xe] = -(pcVar3[0xe] == cVar17);
                          auVar49[0xf] = -(bVar25 == bVar18);
                          uVar27 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                                                 (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe);
                          if (uVar27 != 0) {
                            lVar36 = foundImports._128_8_ + uVar38 * 0x10;
                            lVar40 = foundImports._136_8_ + uVar38 * 0x168;
                            elements = pvVar42;
                            do {
                              uVar13 = 0;
                              if (uVar27 != 0) {
                                for (; (uVar27 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                                }
                              }
                              bVar24 = std::
                                       equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       ::operator()((
                                                  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                                  *)&foundImports.super_Storage.field_0x68,&name,
                                                  (basic_string_view<char,_std::char_traits<char>_>
                                                   *)(lVar40 + (ulong)uVar13 * 0x18));
                              if (bVar24) goto LAB_00428503;
                              uVar27 = uVar27 - 1 & uVar27;
                            } while (uVar27 != 0);
                            bVar25 = *(byte *)(lVar36 + 0xf);
                            pvVar42 = elements;
                          }
                          if (((byte)pvVar42[0x361a6].first._M_len & bVar25) == 0) break;
                          lVar40 = uVar38 + uVar43;
                          uVar43 = uVar43 + 1;
                          uVar38 = lVar40 + 1U & foundImports._120_8_;
                        } while (uVar43 <= (ulong)foundImports._120_8_);
                        if ((ulong)foundImports._152_8_ < (ulong)foundImports._144_8_) {
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                          ::
                          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::ModportSubroutinePortSyntax*>
                                    ((locator *)&res,
                                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                      *)&foundImports.super_Storage.field_0x68,
                                     (arrays_type *)&foundImports.field_0x70,uVar41,uVar31,
                                     &local_299,&name,&local_210);
                          foundImports._152_8_ = foundImports._152_8_ + 1;
                        }
                        else {
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                          ::
                          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::ModportSubroutinePortSyntax*>
                                    ((locator *)&res,
                                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                      *)&foundImports.super_Storage.field_0x68,uVar31,&local_299,
                                     &name,&local_210);
                        }
                      }
                    }
                  }
LAB_00428503:
                  uVar34 = uVar34 + 1;
                } while (uVar34 != lVar9 + 1U >> 1);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != (ulong)pbVar29 >> 1);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != lVar6 + 1U >> 1);
      }
      ppSVar37 = ppSVar37 + 1;
    } while (ppSVar37 != ppSVar1);
    res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
             foundImports.super_Storage._104_8_;
    if (foundImports._136_8_ != 0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>
                    *)&res,(pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>
                            *)foundImports._136_8_,(foundImports._120_8_ * 0x178 + 0x186U) / 0x18);
    }
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  ::delete_((allocator_type)waitingForImport.super_Storage._72_8_,
            (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
             *)&waitingForImport.field_0x50);
  return;
}

Assistant:

void Scope::handleExportedMethods(std::span<Symbol* const> deferredMembers) const {
    SmallSet<std::string_view, 4> waitingForImport;
    SmallMap<std::string_view, const ModportSubroutinePortSyntax*, 4> foundImports;

    auto create = [&](const ModportSubroutinePortSyntax& syntax) {
        auto& symbol = MethodPrototypeSymbol::implicitExtern(*this, syntax);
        insertMember(&symbol, nullptr, true, true);
    };

    for (auto symbol : deferredMembers) {
        auto& node = symbol->as<DeferredMemberSymbol>().node;
        if (node.kind != SyntaxKind::ModportDeclaration)
            continue;

        for (auto item : node.as<ModportDeclarationSyntax>().items) {
            for (auto port : item->ports->ports) {
                if (port->kind != SyntaxKind::ModportSubroutinePortList)
                    continue;

                auto& portList = port->as<ModportSubroutinePortListSyntax>();
                bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;

                for (auto subPort : portList.ports) {
                    switch (subPort->kind) {
                        case SyntaxKind::ModportNamedPort: {
                            // A simple named export is not enough to create a
                            // new extern prototype, but if an import has already
                            // declared it for us then we can take details from that.
                            // Otherwise remember it in case we see an import for it later.
                            if (isExport) {
                                auto& mnps = subPort->as<ModportNamedPortSyntax>();
                                auto name = mnps.name.valueText();
                                if (name.empty() || nameMap->find(name) != nameMap->end())
                                    break;

                                if (auto it = foundImports.find(name); it != foundImports.end())
                                    create(*it->second);
                                else
                                    waitingForImport.emplace(name);
                            }
                            break;
                        }
                        case SyntaxKind::ModportSubroutinePort: {
                            // If this is an export, see if this should create an implicit
                            // extern prototype. If it's an import then see if a previous
                            // export is waiting for it to be declared.
                            auto& msps = subPort->as<ModportSubroutinePortSyntax>();
                            auto name = msps.prototype->name->getLastToken().valueText();
                            if (name.empty() || nameMap->find(name) != nameMap->end())
                                break;

                            if (isExport) {
                                create(msps);
                            }
                            else {
                                if (waitingForImport.find(name) != waitingForImport.end())
                                    create(msps);
                                else
                                    foundImports.emplace(name, &msps);
                            }
                            break;
                        }
                        default:
                            SLANG_UNREACHABLE;
                    }
                }
            }
        }
    }
}